

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O0

void NormalizeInclude(cmMakefile *mf,string *inc)

{
  bool bVar1;
  string *a;
  char local_59;
  string local_58;
  string_view local_38;
  long local_28;
  size_type e;
  size_type b;
  string *inc_local;
  cmMakefile *mf_local;
  
  b = (size_type)inc;
  inc_local = (string *)mf;
  e = std::__cxx11::string::find_first_not_of((char *)inc,0x10640e5);
  local_28 = std::__cxx11::string::find_last_not_of((char *)b,0x10640e5);
  if ((e == 0xffffffffffffffff) || (local_28 == -1)) {
    std::__cxx11::string::clear();
  }
  else {
    std::__cxx11::string::assign((string *)b,b,e);
    local_38 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)b);
    bVar1 = cmIsOff(local_38);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes((string *)b);
      bVar1 = cmsys::SystemTools::FileIsFullPath((string *)b);
      if (!bVar1) {
        bVar1 = cmGeneratorExpression::StartsWithGeneratorExpression((string *)b);
        if (!bVar1) {
          a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)inc_local);
          local_59 = '/';
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&>
                    (&local_58,a,&local_59,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b);
          std::__cxx11::string::operator=((string *)b,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

static void NormalizeInclude(cmMakefile& mf, std::string& inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b != std::string::npos) && (e != std::string::npos)) {
    inc.assign(inc, b, 1 + e - b); // copy the remaining substring
  } else {
    inc.clear();
    return;
  }

  if (!cmIsOff(inc)) {
    cmSystemTools::ConvertToUnixSlashes(inc);
    if (!cmSystemTools::FileIsFullPath(inc) &&
        !cmGeneratorExpression::StartsWithGeneratorExpression(inc)) {
      inc = cmStrCat(mf.GetCurrentSourceDirectory(), '/', inc);
    }
  }
}